

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_splitor.cc
# Opt level: O0

void __thiscall xLearn::FileSpliter::split(FileSpliter *this,string *filename,int num_blocks)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined8 uVar8;
  FILE *pFVar9;
  ostream *poVar10;
  int in_EDX;
  int ret_1;
  uint64 real_file_size;
  char *map_ptr_write;
  int i_1;
  char *map_ptr_read;
  int ret;
  string name;
  int i;
  int *file_desc_write;
  FILE **file_ptr_write;
  uint64 offset;
  uint64 next_block_size;
  uint64 average_block_size;
  uint64 file_size;
  int file_desc_read;
  FILE *file_ptr_read;
  Logger *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  LogSeverity LVar11;
  FILE *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc48;
  allocator *paVar12;
  char *in_stack_fffffffffffffc50;
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  Logger local_258;
  int local_254;
  size_t local_250;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [36];
  Logger local_1f4;
  char *local_1f0;
  int local_1e8;
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [36];
  Logger local_194;
  char *local_190;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  Logger local_138;
  int local_134;
  string local_130 [36];
  uint local_10c;
  void *local_108;
  void *local_100;
  long local_f8;
  size_t local_f0;
  ulong local_e8;
  uint64 local_e0;
  int local_d4;
  FILE *local_d0;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Logger local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  Logger local_18;
  int local_14;
  
  local_14 = in_EDX;
  bVar3 = std::__cxx11::string::empty();
  LVar11 = (LogSeverity)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  if ((bVar3 & 1) == 1) {
    Logger::Logger(&local_18,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"split",&local_71);
    poVar6 = Logger::Start(LVar11,in_stack_fffffffffffffb08,iVar5,in_stack_fffffffffffffaf8);
    poVar6 = std::operator<<(poVar6,"CHECK_NE failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x29);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"filename.empty()");
    poVar6 = std::operator<<(poVar6," = ");
    bVar4 = (bool)std::__cxx11::string::empty();
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,bVar4);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,true);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffa90);
    abort();
  }
  if (local_14 < 2) {
    Logger::Logger(&local_78,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"split",&local_c1);
    poVar6 = Logger::Start(LVar11,in_stack_fffffffffffffb08,iVar5,in_stack_fffffffffffffaf8);
    poVar6 = std::operator<<(poVar6,"CHECK_GE failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2a);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"num_blocks");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_14);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"2");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,2);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    Logger::~Logger(in_stack_fffffffffffffa90);
    abort();
  }
  std::__cxx11::string::c_str();
  local_d0 = (FILE *)OpenFileOrDie(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_d4 = fileno(local_d0);
  local_e0 = GetFileSize(in_stack_fffffffffffffc00);
  local_e8 = local_e0 / (ulong)(long)local_14;
  local_f0 = (local_e8 + local_e0) - local_e8 * (long)local_14;
  local_f8 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_14;
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  local_100 = operator_new__(uVar7);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_14;
  uVar7 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  local_108 = operator_new__(uVar7);
  for (local_10c = 0; (int)local_10c < local_14; local_10c = local_10c + 1) {
    uVar8 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)local_130,"%s_%d",uVar8,(ulong)local_10c);
    std::__cxx11::string::c_str();
    pFVar9 = OpenFileOrDie(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    *(FILE **)((long)local_100 + (long)(int)local_10c * 8) = pFVar9;
    iVar5 = fileno(*(FILE **)((long)local_100 + (long)(int)local_10c * 8));
    *(int *)((long)local_108 + (long)(int)local_10c * 4) = iVar5;
    local_134 = ftruncate(*(int *)((long)local_108 + (long)(int)local_10c * 4),local_f0 + 0xa00000);
    LVar11 = (LogSeverity)((ulong)in_stack_fffffffffffffb10 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    if (local_134 != 0) {
      Logger::Logger(&local_138,ERR);
      paVar12 = &local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_158,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                 ,paVar12);
      paVar12 = &local_181;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"split",paVar12);
      poVar6 = Logger::Start(LVar11,in_stack_fffffffffffffb08,iVar5,in_stack_fffffffffffffaf8);
      poVar6 = std::operator<<(poVar6,"CHECK_EQ failed ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x45);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"ret");
      poVar6 = std::operator<<(poVar6," = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_134);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"0");
      poVar6 = std::operator<<(poVar6," = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      Logger::~Logger(in_stack_fffffffffffffa90);
      abort();
    }
    std::__cxx11::string::~string(local_130);
  }
  local_190 = (char *)mmap((void *)0x0,local_e0,1,2,local_d4,0);
  LVar11 = (LogSeverity)((ulong)in_stack_fffffffffffffb10 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  if (local_190 == (char *)0xffffffffffffffff) {
    Logger::Logger(&local_194,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
               ,&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"split",&local_1e1);
    poVar6 = Logger::Start(LVar11,in_stack_fffffffffffffb08,iVar5,in_stack_fffffffffffffaf8);
    poVar6 = std::operator<<(poVar6,"CHECK_NE failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4d);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"map_ptr_read");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::operator<<(poVar6,local_190);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"MAP_FAILED");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(void *)0xffffffffffffffff);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    Logger::~Logger(in_stack_fffffffffffffa90);
    abort();
  }
  local_1e8 = 0;
  while( true ) {
    if (local_14 <= local_1e8) {
      munmap(local_190,local_e0);
      return;
    }
    local_1f0 = (char *)mmap((void *)0x0,local_f0,2,1,
                             *(int *)((long)local_108 + (long)local_1e8 * 4),0);
    LVar11 = (LogSeverity)((ulong)in_stack_fffffffffffffb10 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    if (local_1f0 == (char *)0xffffffffffffffff) break;
    local_250 = local_f0;
    memcpy(local_1f0,local_190 + local_f8,local_f0);
    for (; local_1f0[local_250 - 1] != '\n'; local_250 = local_250 - 1) {
    }
    munmap(local_1f0,local_f0);
    local_254 = ftruncate(*(int *)((long)local_108 + (long)local_1e8 * 4),local_250);
    LVar11 = (LogSeverity)((ulong)in_stack_fffffffffffffb10 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    if (local_254 != 0) {
      Logger::Logger(&local_258,ERR);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_278,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                 ,&local_279);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"split",&local_2a1);
      poVar6 = Logger::Start(LVar11,in_stack_fffffffffffffb08,iVar5,in_stack_fffffffffffffaf8);
      poVar6 = std::operator<<(poVar6,"CHECK_EQ failed ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5e);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"ret");
      poVar6 = std::operator<<(poVar6," = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_254);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar10 = std::operator<<(poVar6,"0");
      poVar10 = std::operator<<(poVar10," = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      std::operator<<(poVar10,"\n");
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      Logger::~Logger((Logger *)poVar6);
      abort();
    }
    local_f0 = local_e8 + (local_f0 - local_250);
    local_f8 = local_250 + local_f8;
    local_1e8 = local_1e8 + 1;
    local_254 = 0;
  }
  Logger::Logger(&local_1f4,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_218,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
             ,&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"split",&local_241);
  poVar6 = Logger::Start(LVar11,in_stack_fffffffffffffb08,iVar5,in_stack_fffffffffffffaf8);
  poVar6 = std::operator<<(poVar6,"CHECK_NE failed ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/file_splitor.cc"
                          );
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x56);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"map_ptr_write");
  poVar6 = std::operator<<(poVar6," = ");
  poVar6 = std::operator<<(poVar6,local_1f0);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"MAP_FAILED");
  poVar6 = std::operator<<(poVar6," = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(void *)0xffffffffffffffff);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  Logger::~Logger(in_stack_fffffffffffffa90);
  abort();
}

Assistant:

void FileSpliter::split(const std::string& filename, int num_blocks) {
  CHECK_NE(filename.empty(), true);
  CHECK_GE(num_blocks, 2); // At least we need two blocks for CV.
  // Input
#ifndef _MSC_VER
  FILE* file_ptr_read = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE* file_ptr_read = OpenFileOrDie(filename.c_str(), "rb");
#endif
  int file_desc_read = fileno(file_ptr_read);
  uint64 file_size = GetFileSize(file_ptr_read);
  uint64 average_block_size = file_size / num_blocks;
  uint64 next_block_size = average_block_size +
      file_size - (average_block_size * num_blocks);
  uint64 offset = 0;
  // Output
  FILE** file_ptr_write = new FILE* [num_blocks];
  int* file_desc_write = new int [num_blocks];

  for (int i = 0; i < num_blocks; ++i) {
    std::string name = StringPrintf("%s_%d", filename.c_str(), i);
#ifndef _MSC_VER
    file_ptr_write[i] = OpenFileOrDie(name.c_str(), "w+");
#else
    file_ptr_write[i] = OpenFileOrDie(name.c_str(), "wb+");
#endif
    file_desc_write[i] = fileno(file_ptr_write[i]);
    int ret = ftruncate(file_desc_write[i], 
      next_block_size + kMaxLineSize);
    CHECK_EQ(ret, 0);
  }
  char* map_ptr_read = (char*)mmap(NULL,
                                   file_size,
                                   PROT_READ,
                                   MAP_PRIVATE,
                                   file_desc_read,
                                   0);
  CHECK_NE(map_ptr_read, MAP_FAILED);

  for (int i = 0; i < num_blocks; ++i) {
    char* map_ptr_write = (char *)mmap(NULL,
                                       next_block_size,
                                       PROT_WRITE,
                                       MAP_SHARED,
                                       file_desc_write[i],
                                       0);
    CHECK_NE(map_ptr_write, MAP_FAILED);
    uint64 real_file_size = next_block_size;
    memcpy(map_ptr_write, map_ptr_read+offset, real_file_size);
    while (map_ptr_write[real_file_size-1] != '\n') {
      real_file_size--;
    }
    munmap(map_ptr_write, next_block_size);
    int ret = ftruncate(file_desc_write[i], real_file_size);
    CHECK_EQ(ret, 0);
    next_block_size =
        average_block_size + (next_block_size - real_file_size);
    offset += real_file_size;
#ifdef _MSC_VER
  Close(file_ptr_write[i]);
#endif
  }
  munmap(map_ptr_read, file_size);
#ifdef _MSC_VER
  Close(file_ptr_read);
#endif
}